

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLDocument::NewElement(XMLDocument *this,char *name)

{
  XMLElement *this_00;
  XMLElement *ele;
  char *name_local;
  XMLDocument *this_local;
  
  this_00 = CreateUnlinkedNode<tinyxml2::XMLElement,120>(this,&this->_elementPool);
  XMLElement::SetName(this_00,name,false);
  return this_00;
}

Assistant:

XMLElement* XMLDocument::NewElement( const char* name )
{
    XMLElement* ele = CreateUnlinkedNode<XMLElement>( _elementPool );
    ele->SetName( name );
    return ele;
}